

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

Var Js::RegexHelper::RegexReplaceImpl
              (ScriptContext *scriptContext,RecyclableObject *thisObj,JavascriptString *input,
              RecyclableObject *replacefn)

{
  bool bVar1;
  ScriptConfiguration *this;
  char16_t *varName_00;
  JavascriptRegExp *regularExpression_00;
  JavascriptRegExp *regularExpression;
  PCWSTR varName;
  ScriptConfiguration *scriptConfig;
  RecyclableObject *replacefn_local;
  JavascriptString *input_local;
  RecyclableObject *thisObj_local;
  ScriptContext *scriptContext_local;
  
  this = ScriptContext::GetConfig(scriptContext);
  bVar1 = ScriptConfiguration::IsES6RegExSymbolsEnabled(this);
  if ((bVar1) && (bVar1 = IsRegexSymbolReplaceObservable(thisObj,scriptContext), bVar1)) {
    scriptContext_local =
         (ScriptContext *)RegexEs6ReplaceImpl(scriptContext,thisObj,input,replacefn);
  }
  else {
    bVar1 = ScriptConfiguration::IsES6RegExSymbolsEnabled(this);
    varName_00 = L"String.prototype.replace";
    if (bVar1) {
      varName_00 = L"RegExp.prototype[Symbol.replace]";
    }
    regularExpression_00 = JavascriptRegExp::ToRegExp(thisObj,varName_00,scriptContext);
    scriptContext_local =
         (ScriptContext *)RegexEs5ReplaceImpl(scriptContext,regularExpression_00,input,replacefn);
  }
  return scriptContext_local;
}

Assistant:

Var RegexHelper::RegexReplaceImpl(ScriptContext* scriptContext, RecyclableObject* thisObj, JavascriptString* input, RecyclableObject* replacefn)
    {
        ScriptConfiguration const * scriptConfig = scriptContext->GetConfig();

        if (scriptConfig->IsES6RegExSymbolsEnabled() && IsRegexSymbolReplaceObservable(thisObj, scriptContext))
        {
            return RegexEs6ReplaceImpl(scriptContext, thisObj, input, replacefn);
        }
        else
        {
            PCWSTR varName = scriptConfig->IsES6RegExSymbolsEnabled()
                ? _u("RegExp.prototype[Symbol.replace]")
                : _u("String.prototype.replace");
            JavascriptRegExp* regularExpression = JavascriptRegExp::ToRegExp(thisObj, varName, scriptContext);
            return RegexEs5ReplaceImpl(scriptContext, regularExpression, input, replacefn);
        }
    }